

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandStringParser::CommandStringParser
          (CommandStringParser *this,char *cmd,ParseContext *ctx,uint flags)

{
  char *pcVar1;
  
  (this->super_CommandLineParser).super_OptionParser.ctx_ = ctx;
  (this->super_CommandLineParser).remaining.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_CommandLineParser).remaining.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_CommandLineParser).remaining.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_CommandLineParser).flags = flags;
  (this->super_CommandLineParser).super_OptionParser._vptr_OptionParser =
       (_func_int **)&PTR__CommandStringParser_0012c838;
  pcVar1 = "";
  if (cmd != (char *)0x0) {
    pcVar1 = cmd;
  }
  this->cmd_ = pcVar1;
  (this->tok_)._M_dataplus._M_p = (pointer)&(this->tok_).field_2;
  (this->tok_)._M_string_length = 0;
  (this->tok_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&this->tok_);
  return;
}

Assistant:

CommandStringParser(const char* cmd, ParseContext& ctx, unsigned flags)
		: CommandLineParser(ctx, flags)
		, cmd_(cmd ? cmd : "") {
		tok_.reserve(80);
	}